

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::TransformPromiseNodeBase::tracePromise
          (TransformPromiseNodeBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  void **ppvVar2;
  void *pvVar3;
  
  pPVar1 = (this->dependency).ptr;
  if (pPVar1 != (PromiseNode *)0x0) {
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
              (pPVar1,builder,(ulong)stopAtNextEvent);
  }
  ppvVar2 = builder->current;
  if (ppvVar2 < builder->limit) {
    pvVar3 = this->continuationTracePtr;
    builder->current = ppvVar2 + 1;
    *ppvVar2 = pvVar3;
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // Note that we null out the dependency just before calling our own continuation, which
  // conveniently means that if we're currently executing the continuation when the trace is
  // requested, it won't trace into the obsolete dependency. Nice.
  if (dependency.get() != nullptr) {
    dependency->tracePromise(builder, stopAtNextEvent);
  }

  builder.add(continuationTracePtr);
}